

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O3

void do_call(int *ip)

{
  char cVar1;
  ushort *puVar2;
  ushort **ppuVar3;
  t_proc *ptVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  labldef(loccnt,1);
  data_loccnt = loccnt;
  loccnt = loccnt + 3;
  if (pass == 1) {
    ppuVar3 = __ctype_b_loc();
    puVar2 = *ppuVar3;
    iVar7 = *ip;
    if ((*(byte *)((long)puVar2 + (long)prlnbuf[iVar7] * 2 + 1) & 0x20) != 0) {
      pcVar5 = prlnbuf + (long)iVar7 + 1;
      do {
        iVar7 = iVar7 + 1;
        *ip = iVar7;
        cVar1 = *pcVar5;
        pcVar5 = pcVar5 + 1;
      } while ((*(byte *)((long)puVar2 + (long)cVar1 * 2 + 1) & 0x20) != 0);
    }
    iVar7 = colsym(ip);
    if (iVar7 != 0) {
      check_eol(ip);
      ptVar4 = proc_look();
      if (ptVar4 == (t_proc *)0x0) {
        lablptr = stlook(0);
        if (lablptr == (t_symbol *)0x0) {
          pcVar5 = "Undefined destination!";
          lablptr = (t_symbol *)0x0;
          goto LAB_00112113;
        }
        iVar7 = lablptr->value;
      }
      else if (bank == ptVar4->bank) {
        iVar7 = ptVar4->org + 0xa000;
      }
      else {
        iVar7 = ptVar4->call;
        if (iVar7 == 0) {
          lVar6 = (long)call_ptr;
          iVar7 = call_ptr + 0x8000;
          ptVar4->call = iVar7;
          if (lVar6 == 0) {
            max_bank = max_bank + 1;
            call_bank = max_bank;
          }
          lVar8 = (long)call_bank;
          rom[lVar8][lVar6] = 0xa8;
          map[lVar8][lVar6] = 0x82;
          rom[lVar8][lVar6 + 1] = 'C';
          map[lVar8][lVar6 + 1] = 0x82;
          rom[lVar8][lVar6 + 2] = ' ';
          map[lVar8][lVar6 + 2] = 0x82;
          rom[lVar8][lVar6 + 3] = 'H';
          map[lVar8][lVar6 + 3] = 0x82;
          rom[lVar8][lVar6 + 4] = 0xa9;
          map[lVar8][lVar6 + 4] = 0x82;
          rom[lVar8][lVar6 + 5] = (char)bank_base + (char)ptVar4->bank;
          map[lVar8][lVar6 + 5] = 0x82;
          rom[lVar8][lVar6 + 6] = 'S';
          map[lVar8][lVar6 + 6] = 0x82;
          rom[lVar8][lVar6 + 7] = ' ';
          map[lVar8][lVar6 + 7] = 0x82;
          rom[lVar8][lVar6 + 8] = 0x98;
          map[lVar8][lVar6 + 8] = 0x82;
          rom[lVar8][lVar6 + 9] = ' ';
          map[lVar8][lVar6 + 9] = 0x82;
          rom[lVar8][lVar6 + 10] = (uchar)ptVar4->org;
          map[lVar8][lVar6 + 10] = 0x82;
          rom[lVar8][lVar6 + 0xb] = *(char *)((long)&ptVar4->org + 1) + 0xa0;
          map[lVar8][lVar6 + 0xb] = 0x82;
          rom[lVar8][lVar6 + 0xc] = 0xa8;
          map[lVar8][lVar6 + 0xc] = 0x82;
          rom[lVar8][lVar6 + 0xd] = 'h';
          map[lVar8][lVar6 + 0xd] = 0x82;
          rom[lVar8][lVar6 + 0xe] = 'S';
          map[lVar8][lVar6 + 0xe] = 0x82;
          rom[lVar8][lVar6 + 0xf] = ' ';
          map[lVar8][lVar6 + 0xf] = 0x82;
          rom[lVar8][lVar6 + 0x10] = 0x98;
          map[lVar8][lVar6 + 0x10] = 0x82;
          call_ptr = call_ptr + 0x12;
          rom[lVar8][lVar6 + 0x11] = '`';
          map[lVar8][lVar6 + 0x11] = 0x82;
        }
      }
      putbyte(data_loccnt,0x20);
      putword(data_loccnt + 1,iVar7);
      println();
      return;
    }
    if (symbol[0] == '\0') {
      pcVar5 = "Syntax error!";
LAB_00112113:
      fatal_error(pcVar5);
      return;
    }
  }
  return;
}

Assistant:

void
do_call(int *ip)
{
	struct t_proc *ptr;
	int value;

	/* define label */
	labldef(loccnt, 1);

	/* update location counter */
	data_loccnt = loccnt;
	loccnt += 3;

	/* generate code */
	if (pass == LAST_PASS) {
		/* skip spaces */
		while (isspace(prlnbuf[*ip]))
			(*ip)++;

		/* extract name */
		if (!colsym(ip)) {
			if (symbol[0] == 0)
				fatal_error("Syntax error!");
			return;
		}

		/* check end of line */
		check_eol(ip);

		/* lookup proc table */
		if((ptr = proc_look())) {
			/* check banks */
			if (bank == ptr->bank)
				value = ptr->org + 0xA000;
			else {
				/* different */
				if (ptr->call)
					value = ptr->call;
				else {
					/* new call */
					value = call_ptr + 0x8000;
					ptr->call = value;

					/* init */
					if (call_ptr == 0) {
						call_bank = ++max_bank;
					}

					/* install */
					poke(call_ptr++, 0xA8);			// tay
					poke(call_ptr++, 0x43);			// tma #5
					poke(call_ptr++, 0x20);
					poke(call_ptr++, 0x48);			// pha
					poke(call_ptr++, 0xA9);			// lda #...
					poke(call_ptr++, ptr->bank+bank_base);
					poke(call_ptr++, 0x53);			// tam #5
					poke(call_ptr++, 0x20);
					poke(call_ptr++, 0x98);			// tya
					poke(call_ptr++, 0x20);			// jsr ...
					poke(call_ptr++, (ptr->org & 0xFF));
					poke(call_ptr++, (ptr->org >> 8) + 0xA0);
					poke(call_ptr++, 0xA8);			// tay
					poke(call_ptr++, 0x68);			// pla
					poke(call_ptr++, 0x53);			// tam #5
					poke(call_ptr++, 0x20);
					poke(call_ptr++, 0x98);			// tya
					poke(call_ptr++, 0x60);			// rts
				}
			}
		}
		else {
			/* lookup symbol table */
			if ((lablptr = stlook(0)) == NULL) {
				fatal_error("Undefined destination!");
				return;
			}

			/* get symbol value */
			value = lablptr->value;
		}

		/* opcode */
		putbyte(data_loccnt, 0x20);
		putword(data_loccnt+1, value);

		/* output line */
		println();
	}
}